

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int prepareFreeAndCollectError(sqlite3 *db,sqlite3_stmt **ppStmt,char **pzErrmsg,char *zSql)

{
  int iVar1;
  
  if (zSql != (char *)0x0) {
    iVar1 = prepareAndCollectError(db,ppStmt,pzErrmsg,zSql);
    sqlite3_free(zSql);
    return iVar1;
  }
  *ppStmt = (sqlite3_stmt *)0x0;
  return 7;
}

Assistant:

static int prepareFreeAndCollectError(
  sqlite3 *db, 
  sqlite3_stmt **ppStmt,
  char **pzErrmsg,
  char *zSql
){
  int rc;
  assert( *pzErrmsg==0 );
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
    *ppStmt = 0;
  }else{
    rc = prepareAndCollectError(db, ppStmt, pzErrmsg, zSql);
    sqlite3_free(zSql);
  }
  return rc;
}